

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

bool __thiscall Lowerer::GenerateFastBrOrCmString(Lowerer *this,Instr *instr)

{
  OpCode OVar1;
  code *pcVar2;
  LabelInstr *instr_00;
  OpndKind OVar3;
  bool bVar4;
  undefined4 *puVar5;
  LabelInstr *labelHelper;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar6;
  undefined7 extraout_var;
  undefined7 uVar10;
  LabelInstr *pLVar7;
  Opnd *pOVar8;
  Opnd *src;
  Instr *pIVar9;
  uint uVar11;
  RegOpnd *srcReg2;
  Lowerer *pLVar12;
  RegOpnd *srcReg1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_60;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5c;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_5a;
  LabelInstr *local_58;
  undefined8 local_50;
  Lowerer *local_48;
  LabelInstr *local_40;
  undefined4 local_34;
  
  OVar3 = IR::Opnd::GetKind(instr->m_src1);
  if (OVar3 == OpndKindReg) {
    srcReg1 = (RegOpnd *)instr->m_src1;
    OVar3 = IR::Opnd::GetKind((Opnd *)srcReg1);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_005dbcec;
      *puVar5 = 0;
    }
  }
  else {
    srcReg1 = (RegOpnd *)0x0;
  }
  OVar3 = IR::Opnd::GetKind(instr->m_src2);
  if (OVar3 == OpndKindReg) {
    srcReg2 = (RegOpnd *)instr->m_src2;
    OVar3 = IR::Opnd::GetKind((Opnd *)srcReg2);
    if (OVar3 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_005dbcec;
      *puVar5 = 0;
    }
  }
  else {
    srcReg2 = (RegOpnd *)0x0;
  }
  if (((srcReg2 == (RegOpnd *)0x0 || srcReg1 == (RegOpnd *)0x0) ||
      (bVar4 = IR::Opnd::IsTaggedInt(&srcReg1->super_Opnd), bVar4)) ||
     (bVar4 = IR::Opnd::IsTaggedInt(&srcReg2->super_Opnd), bVar4)) {
    return false;
  }
  local_60 = (srcReg1->super_Opnd).m_valueType.field_0;
  bVar4 = ValueType::HasHadStringTag((ValueType *)&local_60.field_0);
  if (!bVar4) {
    local_5e = (srcReg2->super_Opnd).m_valueType.field_0;
    bVar4 = ValueType::IsString((ValueType *)&local_5e.field_0);
    if (!bVar4) {
      return false;
    }
  }
  local_5c = (srcReg2->super_Opnd).m_valueType.field_0;
  bVar4 = ValueType::HasHadStringTag((ValueType *)&local_5c.field_0);
  if (!bVar4) {
    local_5a = (srcReg1->super_Opnd).m_valueType.field_0;
    bVar4 = ValueType::IsString((ValueType *)&local_5a.field_0);
    if (!bVar4) {
      return false;
    }
  }
  labelHelper = IR::LabelInstr::New(Label,this->m_func,true);
  OVar1 = instr->m_opcode;
  pLVar12 = (Lowerer *)0x0;
  switch(OVar1) {
  case BrNeq_A:
    goto switchD_005db97b_caseD_194;
  case BrFalse_A:
  case BrTrue_A:
  case BrGe_A:
  case BrGt_A:
  case BrLt_A:
  case BrLe_A:
    goto switchD_005db933_caseD_3c;
  case BrSrEq_A:
switchD_005db97b_caseD_197:
    pLVar12 = (Lowerer *)&DAT_00000001;
  case BrEq_A:
switchD_005db97b_caseD_195:
    pLVar7 = IR::LabelInstr::New(Label,this->m_func,false);
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      local_58 = pLVar7;
      Js::Throw::LogAssert();
      local_40 = (LabelInstr *)__tls_get_addr(&PTR_0155fe48);
      *(undefined4 *)&(local_40->super_Instr)._vptr_Instr = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar4) {
LAB_005dbcec:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *(undefined4 *)&(local_40->super_Instr)._vptr_Instr = 0;
      pLVar7 = local_58;
    }
    local_40 = (LabelInstr *)instr[1].m_next;
    local_48 = pLVar12;
    IR::Instr::InsertAfter(instr,&pLVar7->super_Instr);
    uVar6 = CONCAT71((int7)((ulong)extraout_RAX_00 >> 8),1);
    local_34 = (undefined4)uVar6;
    break;
  case BrSrNeq_A:
switchD_005db97b_caseD_196:
    pLVar12 = (Lowerer *)&DAT_00000001;
switchD_005db97b_caseD_194:
    local_48 = pLVar12;
    local_40 = IR::LabelInstr::New(Label,this->m_func,false);
    if (instr->m_kind != InstrKindBranch) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
      if (!bVar4) goto LAB_005dbcec;
      *puVar5 = 0;
    }
    pLVar7 = (LabelInstr *)instr[1].m_next;
    IR::Instr::InsertAfter(instr,&local_40->super_Instr);
    local_34 = 0;
    uVar6 = extraout_RAX;
    break;
  default:
    switch(OVar1) {
    case CmEq_A:
      local_48 = (Lowerer *)0x0;
      goto LAB_005dbb81;
    case CmGe_A:
    case CmGt_A:
    case CmLt_A:
    case CmLe_A:
      goto switchD_005db933_caseD_3c;
    case CmNeq_A:
      local_48 = (Lowerer *)0x0;
      goto LAB_005dbb61;
    case CmSrEq_A:
      local_48 = (Lowerer *)((long)&switchD_005c8af0::switchdataD_0104a200 + 1);
LAB_005dbb81:
      local_34 = 0x104a201;
      uVar10 = 0x104a2;
      bVar4 = false;
      goto LAB_005dbb84;
    case CmSrNeq_A:
      local_48 = (Lowerer *)((long)&switchD_005c8af0::switchdataD_0104a200 + 1);
LAB_005dbb61:
      local_34 = 0;
      bVar4 = false;
      local_50 = 0;
      goto LAB_005dbb8a;
    }
    switch(OVar1) {
    case BrNotEq_A:
      goto switchD_005db97b_caseD_194;
    case BrNotNeq_A:
      goto switchD_005db97b_caseD_195;
    case BrSrNotEq_A:
      goto switchD_005db97b_caseD_196;
    case BrSrNotNeq_A:
      goto switchD_005db97b_caseD_197;
    }
switchD_005db933_caseD_3c:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5eec,"((0))","(0)");
    if (!bVar4) goto LAB_005dbcec;
    *puVar5 = 0;
    bVar4 = true;
    local_34 = 0;
    local_48 = (Lowerer *)0x0;
    uVar10 = extraout_var;
LAB_005dbb84:
    local_50 = CONCAT71(uVar10,1);
LAB_005dbb8a:
    local_40 = (LabelInstr *)0x0;
    pLVar7 = (LabelInstr *)0x0;
    goto LAB_005dbb8d;
  }
  bVar4 = true;
  local_50 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
LAB_005dbb8d:
  if (!bVar4) {
    local_40 = IR::LabelInstr::New(Label,this->m_func,false);
    pLVar7 = IR::LabelInstr::New(Label,this->m_func,false);
  }
  instr_00 = local_40;
  local_58 = pLVar7;
  GenerateFastStringCheck
            (this,instr,srcReg1,srcReg2,false,local_48._0_1_,labelHelper,local_40,pLVar7);
  pLVar7 = IR::LabelInstr::New(Label,this->m_func,false);
  if (!bVar4) {
    uVar11 = (uint)(byte)local_50;
    local_48 = this;
    IR::Instr::InsertBefore(instr,&instr_00->super_Instr);
    pLVar12 = local_48;
    local_40 = (LabelInstr *)instr->m_dst;
    pOVar8 = LoadLibraryValueOpnd(local_48,instr,ValueFalse - uVar11);
    InsertMove((Opnd *)local_40,pOVar8,instr,true);
    InsertBranch(Br,false,pLVar7,instr);
    IR::Instr::InsertBefore(instr,&local_58->super_Instr);
    pOVar8 = instr->m_dst;
    src = LoadLibraryValueOpnd(pLVar12,instr,uVar11 + ValueTrue);
    InsertMove(pOVar8,src,instr,true);
    InsertBranch(Br,false,pLVar7,instr);
  }
  IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
  IR::Instr::InsertAfter(instr,&pLVar7->super_Instr);
  if ((char)local_34 == '\0') {
    labelHelper = (LabelInstr *)instr;
  }
  pIVar9 = IR::Instr::GetNextBranchOrLabel(&labelHelper->super_Instr);
  if (pIVar9->m_kind == InstrKindBranch) {
    *(undefined1 *)((long)&pIVar9[1]._vptr_Instr + 2) = 1;
  }
  pLVar7->field_0x78 = pLVar7->field_0x78 | 0x20;
  return true;
}

Assistant:

bool
Lowerer::GenerateFastBrOrCmString(IR::Instr* instr)
{
    IR::RegOpnd *srcReg1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *srcReg2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;

    if (!srcReg1 ||
        !srcReg2 ||
        srcReg1->IsTaggedInt() ||
        srcReg2->IsTaggedInt() ||
        (!srcReg1->GetValueType().HasHadStringTag() && !srcReg2->GetValueType().IsString()) ||
        (!srcReg2->GetValueType().HasHadStringTag() && !srcReg1->GetValueType().IsString()))
    {
        return false;
    }

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    IR::LabelInstr *labelBranchFail = nullptr;
    IR::LabelInstr *labelBranchSuccess = nullptr;

    bool isEqual = false;
    bool isStrict = false;
    bool isBranch = true;
    bool isCmNegOp = false;

    switch (instr->m_opcode)
    {
    case Js::OpCode::BrSrEq_A:
    case Js::OpCode::BrSrNotNeq_A:
        isStrict = true;
    case Js::OpCode::BrEq_A:
    case Js::OpCode::BrNotNeq_A:
        labelBranchFail = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        labelBranchSuccess = instr->AsBranchInstr()->GetTarget();
        instr->InsertAfter(labelBranchFail);
        isEqual = true;
        break;

    case Js::OpCode::BrSrNeq_A:
    case Js::OpCode::BrSrNotEq_A:
        isStrict = true;
    case Js::OpCode::BrNeq_A:
    case Js::OpCode::BrNotEq_A:
        labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        labelBranchFail = instr->AsBranchInstr()->GetTarget();
        instr->InsertAfter(labelBranchSuccess);
        isEqual = false;
        break;

    case Js::OpCode::CmSrEq_A:
        isStrict = true;
    case Js::OpCode::CmEq_A:
        isEqual = true;
        isBranch = false;
        break;

    case Js::OpCode::CmSrNeq_A:
        isStrict = true;
    case Js::OpCode::CmNeq_A:
        isEqual = false;
        isBranch = false;
        isCmNegOp = true;
        break;

    default:
        Assume(UNREACHED);
    }

    if (!isBranch)
    {
        labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
        labelBranchFail = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    }

    GenerateFastStringCheck(instr, srcReg1, srcReg2, isEqual, isStrict, labelHelper, labelBranchSuccess, labelBranchFail);

    IR::LabelInstr *labelFallthrough = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);

    if (!isBranch)
    {
        const LibraryValue successValueType = !isCmNegOp ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
        const LibraryValue failureValueType = !isCmNegOp ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;

        instr->InsertBefore(labelBranchSuccess);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallthrough, instr);

        instr->InsertBefore(labelBranchFail);
        InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, failureValueType), instr);
        InsertBranch(Js::OpCode::Br, labelFallthrough, instr);
    }

    instr->InsertBefore(labelHelper);

    instr->InsertAfter(labelFallthrough);

#if DBG
    // The fast-path for strings assumes the case where 2 strings are equal is rare, and marks that path as 'helper'.
    // This breaks the helper label dbchecks as it can result in non-helper blocks be reachable only from helper blocks.
    // Use m_isHelperToNonHelperBranch and m_noHelperAssert to fix this.
    IR::Instr *blockEndInstr;

    if (isEqual)
    {
        blockEndInstr = labelHelper->GetNextBranchOrLabel();
    }
    else
    {
        blockEndInstr = instr->GetNextBranchOrLabel();
    }

    if (blockEndInstr->IsBranchInstr())
    {
        blockEndInstr->AsBranchInstr()->m_isHelperToNonHelperBranch = true;
    }

    labelFallthrough->m_noHelperAssert = true;
#endif

    return true;
}